

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_scc_8_aw(void)

{
  uint uVar1;
  uint value;
  
  uVar1 = m68ki_read_imm_16();
  value = 0xff;
  if ((m68ki_cpu.c_flag >> 8 & 1) != 0) {
    value = 0;
  }
  m68ki_write_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_scc_8_aw(void)
{
	m68ki_write_8(EA_AW_8(), COND_CC() ? 0xff : 0);
}